

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.cpp
# Opt level: O0

void __thiscall
spirv_cross::Parser::Parser(Parser *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv_local;
  Parser *this_local;
  
  ParsedIR::ParsedIR(&this->ir);
  this->current_function = (SPIRFunction *)0x0;
  this->current_block = (SPIRBlock *)0x0;
  this->ignore_trailing_block_opcodes = false;
  SmallVector<unsigned_int,_8UL>::SmallVector(&this->global_struct_cache);
  SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL>::SmallVector
            (&this->forward_pointer_fixups);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&(this->ir).spirv,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)spirv);
  return;
}

Assistant:

Parser::Parser(vector<uint32_t> spirv)
{
	ir.spirv = std::move(spirv);
}